

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

FPolyNode * NewPolyNode(void)

{
  FPolyNode *local_10;
  FPolyNode *node;
  
  if (FreePolyNodes == (FPolyNode *)0x0) {
    local_10 = (FPolyNode *)operator_new(0x40);
    FPolyNode::FPolyNode(local_10);
  }
  else {
    local_10 = FreePolyNodes;
    FreePolyNodes = FreePolyNodes->pnext;
  }
  local_10->state = 0x539;
  local_10->poly = (FPolyObj *)0x0;
  local_10->pnext = (FPolyNode *)0x0;
  local_10->pprev = (FPolyNode *)0x0;
  local_10->subsector = (subsector_t *)0x0;
  local_10->snext = (FPolyNode *)0x0;
  return local_10;
}

Assistant:

static FPolyNode *NewPolyNode()
{
	FPolyNode *node;

	if (FreePolyNodes != NULL)
	{
		node = FreePolyNodes;
		FreePolyNodes = node->pnext;
	}
	else
	{
		node = new FPolyNode;
	}
	node->state = 1337;
	node->poly = NULL;
	node->pnext = NULL;
	node->pprev = NULL;
	node->subsector = NULL;
	node->snext = NULL;
	return node;
}